

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O2

Gia_Man_t * Cec_ManCombSpecReduce(Gia_Man_t *p,Vec_Int_t **pvOutputs,int fRings)

{
  undefined8 uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  uint *puVar11;
  ulong uVar12;
  Gia_Man_t *pGVar13;
  uint v;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecChoice.c"
                  ,0x66,"Gia_Man_t *Cec_ManCombSpecReduce(Gia_Man_t *, Vec_Int_t **, int)");
  }
  Gia_ManSetPhase(p);
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar7 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (iVar15 = 0; pGVar13 = (Gia_Man_t *)p->vCis, iVar15 < *(int *)((long)&pGVar13->pName + 4);
      iVar15 = iVar15 + 1) {
    iVar3 = Vec_IntEntry((Vec_Int_t *)pGVar13,iVar15);
    pGVar13 = p;
    pGVar8 = Gia_ManObj(p,iVar3);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    pGVar9 = Gia_ManAppendObj(p_00);
    uVar14 = *(ulong *)pGVar9;
    *(ulong *)pGVar9 = uVar14 | 0x9fffffff;
    *(ulong *)pGVar9 =
         uVar14 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar10 = p_00->vCis;
    iVar3 = Gia_ObjId(p_00,pGVar9);
    Vec_IntPush(pVVar10,iVar3);
    iVar3 = Gia_ObjId(p_00,pGVar9);
    pGVar8->Value = iVar3 * 2;
  }
  iVar15 = (int)pGVar13;
  pVVar10 = Vec_IntAlloc(iVar15);
  *pvOutputs = pVVar10;
  pVVar10 = Vec_IntAlloc(iVar15);
  if (fRings == 0) {
    for (lVar16 = 1; lVar16 < p->nObjs; lVar16 = lVar16 + 1) {
      pGVar8 = Gia_ManObj(p,(int)lVar16);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      iVar15 = Gia_ObjId(p,pGVar8);
      pGVar9 = Gia_ObjReprObj(p,iVar15);
      if (pGVar9 != (Gia_Obj_t *)0x0) {
        if (((uint)p->pReprs[lVar16] & 0xfffffff) == 0) {
          iVar15 = 0;
        }
        else {
          iVar15 = Cec_ManCombSpecReal(p_00,p,pGVar9);
        }
        iVar3 = Cec_ManCombSpecReal(p_00,p,pGVar8);
        iVar3 = Abc_LitNotCond(iVar3,((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) ^
                                     (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20)) >> 0x1f);
        if (iVar15 != iVar3) {
          pVVar2 = *pvOutputs;
          iVar5 = Gia_ObjId(p,pGVar9);
          Vec_IntPush(pVVar2,iVar5);
          pVVar2 = *pvOutputs;
          iVar5 = Gia_ObjId(p,pGVar8);
          Vec_IntPush(pVVar2,iVar5);
          iVar15 = Gia_ManHashXor(p_00,iVar15,iVar3);
          Vec_IntPush(pVVar10,iVar15);
        }
      }
    }
  }
  else {
    for (uVar14 = 1; (long)uVar14 < (long)p->nObjs; uVar14 = uVar14 + 1) {
      iVar15 = (int)uVar14;
      pGVar8 = Gia_ManObj(p,iVar15);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      if (((uint)p->pReprs[uVar14] & 0xfffffff) == 0) {
        iVar3 = Cec_ManCombSpecReal(p_00,p,pGVar8);
        iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pGVar8 >> 0x3f));
        if (iVar3 != 0) {
          Vec_IntPush(*pvOutputs,0);
          Vec_IntPush(*pvOutputs,iVar15);
LAB_0051ae7b:
          Vec_IntPush(pVVar10,iVar3);
        }
      }
      else {
        iVar3 = Gia_ObjIsHead(p,iVar15);
        if (iVar3 != 0) {
          puVar11 = (uint *)(p->pNexts + uVar14);
          uVar12 = uVar14 & 0xffffffff;
          while( true ) {
            uVar6 = *puVar11;
            iVar5 = (int)uVar12;
            pGVar9 = Gia_ManObj(p,iVar5);
            iVar3 = Cec_ManCombSpecReal(p_00,p,pGVar9);
            if ((long)(int)uVar6 < 1) break;
            pGVar9 = Gia_ManObj(p,uVar6);
            iVar4 = Cec_ManCombSpecReal(p_00,p,pGVar9);
            uVar1 = *(undefined8 *)pGVar8;
            pGVar9 = Gia_ManObj(p,iVar5);
            iVar3 = Abc_LitNotCond(iVar3,((uint)((ulong)uVar1 >> 0x20) ^
                                         (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20)) >> 0x1f);
            uVar1 = *(undefined8 *)pGVar8;
            pGVar9 = Gia_ManObj(p,uVar6);
            iVar4 = Abc_LitNotCond(iVar4,((uint)((ulong)uVar1 >> 0x20) ^
                                         (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20)) >> 0x1f);
            if (((iVar4 != 1) && (iVar3 != 0)) && (iVar3 != iVar4)) {
              Vec_IntPush(*pvOutputs,iVar5);
              Vec_IntPush(*pvOutputs,uVar6);
              iVar5 = Abc_LitNot(iVar4);
              iVar3 = Gia_ManHashAnd(p_00,iVar3,iVar5);
              Vec_IntPush(pVVar10,iVar3);
            }
            puVar11 = (uint *)(p->pNexts + (int)uVar6);
            uVar12 = (ulong)uVar6;
          }
          pGVar9 = Gia_ManObj(p,iVar15);
          iVar4 = Cec_ManCombSpecReal(p_00,p,pGVar9);
          uVar1 = *(undefined8 *)pGVar8;
          pGVar9 = Gia_ManObj(p,iVar5);
          iVar3 = Abc_LitNotCond(iVar3,((uint)((ulong)uVar1 >> 0x20) ^
                                       (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20)) >> 0x1f);
          uVar1 = *(undefined8 *)pGVar8;
          pGVar8 = Gia_ManObj(p,iVar15);
          iVar4 = Abc_LitNotCond(iVar4,((uint)((ulong)uVar1 >> 0x20) ^
                                       (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20)) >> 0x1f);
          if (((iVar4 != 1) && (iVar3 != 0)) && (iVar3 != iVar4)) {
            Vec_IntPush(*pvOutputs,iVar5);
            Vec_IntPush(*pvOutputs,iVar15);
            iVar15 = Abc_LitNot(iVar4);
            iVar3 = Gia_ManHashAnd(p_00,iVar3,iVar15);
            goto LAB_0051ae7b;
          }
        }
      }
    }
  }
  iVar15 = pVVar10->nSize;
  iVar3 = 0;
  if (iVar15 < 1) {
    iVar15 = 0;
    iVar3 = 0;
  }
  while( true ) {
    if (iVar15 == iVar3) {
      Vec_IntFree(pVVar10);
      Gia_ManHashStop(p_00);
      pGVar13 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar13;
    }
    uVar6 = Vec_IntEntry(pVVar10,iVar3);
    if (((int)uVar6 < 0) || (v = uVar6 >> 1, p_00->nObjs <= (int)v)) break;
    pGVar8 = Gia_ManObj(p_00,v);
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && (int)*(uint *)pGVar8 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar8 = Gia_ManAppendObj(p_00);
    *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x80000000;
    iVar5 = Gia_ObjId(p_00,pGVar8);
    uVar12 = (ulong)(iVar5 - v & 0x1fffffff);
    uVar14 = *(ulong *)pGVar8;
    uVar17 = (ulong)((uVar6 & 1) << 0x1d);
    *(ulong *)pGVar8 = uVar17 | uVar14 & 0xffffffffc0000000 | uVar12;
    *(ulong *)pGVar8 =
         uVar17 | uVar14 & 0xe0000000c0000000 | uVar12 |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar2 = p_00->vCos;
    iVar5 = Gia_ObjId(p_00,pGVar8);
    Vec_IntPush(pVVar2,iVar5);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),pGVar8);
    }
    Gia_ObjId(p_00,pGVar8);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Cec_ManCombSpecReduce( Gia_Man_t * p, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int i, iPrev, iObj, iPrevNew, iObjNew;
    assert( p->pReprs != NULL );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Cec_ManCombSpecReal( pNew, p, pObj );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                    iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Cec_ManCombSpecReal( pNew, p, pRepr );
            iObjNew  = Cec_ManCombSpecReal( pNew, p, pObj );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}